

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

Error __thiscall
asmjit::BaseCompiler::_newStack
          (BaseCompiler *this,BaseMem *out,uint32_t size,uint32_t alignment,char *name)

{
  uint32_t uVar1;
  Error EVar2;
  uint uVar3;
  VirtReg *in_RAX;
  uint uVar4;
  VirtReg *vReg;
  VirtReg *local_28;
  
  (out->super_Operand).super_Operand_._signature = 2;
  (out->super_Operand).super_Operand_._baseId = 0;
  (out->super_Operand).super_Operand_._data[0] = 0;
  (out->super_Operand).super_Operand_._data[1] = 0;
  if ((size != 0) && (uVar4 = alignment + (alignment == 0), (uVar4 & uVar4 - 1) == 0)) {
    local_28 = in_RAX;
    EVar2 = newVirtReg(this,&local_28,0,0,name);
    if (EVar2 == 0) {
      uVar3 = 0x40;
      if (uVar4 < 0x40) {
        uVar3 = uVar4;
      }
      local_28->_virtSize = size;
      local_28->field_0xf = local_28->field_0xf | 2;
      local_28->_alignment = (uint8_t)uVar3;
      uVar1 = local_28->_id;
      (out->super_Operand).super_Operand_._signature =
           (this->super_BaseBuilder).super_BaseEmitter._gpRegInfo._signature & 0xf8 | 0x2002;
      (out->super_Operand).super_Operand_._baseId = uVar1;
      (out->super_Operand).super_Operand_._data[0] = 0;
      (out->super_Operand).super_Operand_._data[1] = 0;
      EVar2 = 0;
    }
    return EVar2;
  }
  EVar2 = BaseEmitter::reportError((BaseEmitter *)this,2,(char *)0x0);
  return EVar2;
}

Assistant:

Error BaseCompiler::_newStack(BaseMem* out, uint32_t size, uint32_t alignment, const char* name) {
  out->reset();

  if (size == 0)
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment == 0)
    alignment = 1;

  if (!Support::isPowerOf2(alignment))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment > 64)
    alignment = 64;

  VirtReg* vReg;
  ASMJIT_PROPAGATE(newVirtReg(&vReg, 0, 0, name));

  vReg->_virtSize = size;
  vReg->_isStack = true;
  vReg->_alignment = uint8_t(alignment);

  // Set the memory operand to GPD/GPQ and its id to VirtReg.
  *out = BaseMem(BaseMem::Decomposed { _gpRegInfo.type(), vReg->id(), BaseReg::kTypeNone, 0, 0, 0, BaseMem::kSignatureMemRegHomeFlag });
  return kErrorOk;
}